

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Solver::limit(Solver *this,char *arg,int val)

{
  bool bVar1;
  char *__ptr;
  size_t sStack_20;
  
  if ((this->internal != (Internal *)0x0) && (this->trace_api_file != (FILE *)0x0)) {
    trace_api_call(this,"limit",arg,val);
  }
  require_solver_pointer_to_be_non_zero
            (this,"bool CaDiCaL::Solver::limit(const char *, int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
            );
  if (this->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::limit(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "external solver not initialized";
  }
  else {
    if (this->internal != (Internal *)0x0) {
      if ((this->_state & VALID) != 0) {
        bVar1 = Internal::limit(this->internal,arg,val);
        return bVar1;
      }
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
              "bool CaDiCaL::Solver::limit(const char *, int)",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      __ptr = "solver in invalid state";
      sStack_20 = 0x17;
      goto LAB_006847d6;
    }
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "bool CaDiCaL::Solver::limit(const char *, int)",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    __ptr = "internal solver not initialized";
  }
  sStack_20 = 0x1f;
LAB_006847d6:
  fwrite(__ptr,sStack_20,1,_stderr);
  fputc(10,_stderr);
  fflush(_stderr);
  abort();
}

Assistant:

bool Solver::limit (const char *arg, int val) {
  TRACE ("limit", arg, val);
  REQUIRE_VALID_STATE ();
  bool res = internal->limit (arg, val);
  LOG_API_CALL_END ("limit", arg, val, res);
  return res;
}